

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_transaction.cpp
# Opt level: O1

void __thiscall
cpp_db::sqlite_transaction::sqlite_transaction
          (sqlite_transaction *this,shared_connection_ptr *conn_in)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  runtime_error *this_00;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  (this->super_transaction_interface)._vptr_transaction_interface =
       (_func_int **)&PTR__sqlite_transaction_001999f8;
  (this->conn).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (conn_in->super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Var1 = (conn_in->super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->conn).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_weak_count = p_Var1->_M_weak_count + 1;
    }
  }
  this->open_count = 0;
  p_Var1 = (this->conn).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (p_Var1->_M_use_count != 0)
     ) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"No database connection!","");
  std::runtime_error::runtime_error(this_00,(string *)local_48);
  *(undefined ***)this_00 = &PTR__runtime_error_00199840;
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

sqlite_transaction::sqlite_transaction(const shared_connection_ptr &conn_in)
	: conn(conn_in)
    , open_count(0)
{
	if (conn.expired())
        throw db_exception("No database connection!");
}